

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superstep.hpp
# Opt level: O2

int __thiscall
Superstep<int>::runStep
          (Superstep<int> *this,vector<WorkerThread,_std::allocator<WorkerThread>_> *workers,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *inputVectors,
          vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *outputVectors)

{
  int iVar1;
  long lVar2;
  runtime_error *this_00;
  ulong uVar3;
  long lVar4;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  Barrier *local_88;
  Barrier *local_80;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_78;
  vector<WorkerThread,_std::allocator<WorkerThread>_> *local_70;
  Task local_68;
  type boundedFunction;
  
  uVar3 = (long)(this->activitiesFunctions).
                super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->activitiesFunctions).
                super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 6;
  local_70 = workers;
  if ((ulong)((long)(workers->super__Vector_base<WorkerThread,_std::allocator<WorkerThread>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(workers->super__Vector_base<WorkerThread,_std::allocator<WorkerThread>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 7) < uVar3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "Mismatching between number of workers and number of activities! (#workers < #activities)"
              );
  }
  else {
    lVar2 = (long)(inputVectors->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(inputVectors->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    local_78 = inputVectors;
    if (uVar3 <= (ulong)(lVar2 / 0x18)) {
      local_80 = &this->commPhaseBarrier;
      Barrier::reset(local_80,(int)uVar3);
      Barrier::reset(&this->compPhaseBarrier,
                     (int)((ulong)((long)(this->activitiesFunctions).
                                         super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->activitiesFunctions).
                                        super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 6));
      local_88 = &this->startBarrier;
      Barrier::reset(local_88,1);
      lVar2 = 0;
      lVar4 = 0;
      for (uVar3 = 0;
          uVar3 < (ulong)((long)(this->activitiesFunctions).
                                super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->activitiesFunctions).
                                super__Vector_base<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 6); uVar3 = uVar3 + 1)
      {
        boundedFunction._M_bound_args.
        super__Tuple_impl<0UL,_unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
        .
        super__Tuple_impl<1UL,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
        .
        super__Head_base<1UL,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_false>
        ._M_head_impl._M_data =
             (reference_wrapper<std::vector<int,_std::allocator<int>_>_>)
             ((long)&(((local_78->
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             + lVar4);
        boundedFunction._M_f.this = this;
        boundedFunction._M_bound_args.
        super__Tuple_impl<0UL,_unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
        .
        super__Tuple_impl<1UL,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
        .
        super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
        .
        super__Head_base<2UL,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>,_false>
        ._M_head_impl._M_data =
             (_Head_base<2UL,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>,_false>
              )(_Head_base<2UL,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>,_false>
                )outputVectors;
        boundedFunction._M_bound_args.
        super__Tuple_impl<0UL,_unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>_>
        .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar3;
        std::packaged_task<void()>::
        packaged_task<std::_Bind<Superstep<int>::runStep(std::vector<WorkerThread,std::allocator<WorkerThread>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>&)::_lambda(int,std::vector<int,std::allocator<int>>&,std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>&)_1_(unsigned_long,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>>)>&,void>
                  ((packaged_task<void()> *)&local_98,&boundedFunction);
        local_68._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = p_Stack_90;
        local_68._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_98;
        local_98 = (element_type *)0x0;
        p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        WorkerThread::assignActivity
                  ((WorkerThread *)
                   ((long)&(((local_70->
                             super__Vector_base<WorkerThread,_std::allocator<WorkerThread>_>).
                             _M_impl.super__Vector_impl_data._M_start)->workerThread)._M_id.
                           _M_thread + lVar2),&local_68);
        std::packaged_task<void_()>::~packaged_task(&local_68);
        std::packaged_task<void_()>::~packaged_task((packaged_task<void_()> *)&local_98);
        lVar4 = lVar4 + 0x18;
        lVar2 = lVar2 + 0x80;
      }
      Barrier::decreaseBarrier(local_88);
      Barrier::waitForFinish(local_80);
      iVar1 = std::
              function<int_(std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_&)>
              ::operator()(&this->atExitF,outputVectors);
      return iVar1;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10,uVar3,lVar2 % 0x18);
    std::runtime_error::runtime_error
              (this_00,
               "Mismatching between number of activities and number of input queues! (#activities > #queues)"
              );
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int Superstep<T>::runStep (std::vector<WorkerThread> &workers,
							std::vector<std::vector<T>>	&inputVectors,
							std::vector<LockableVector<T>> &outputVectors) {

	if (workers.size () < activitiesFunctions.size()) {
		throw std::runtime_error ("Mismatching between number of workers and number of activities! (#workers < #activities)");
	}
	if (inputVectors.size() < activitiesFunctions.size())
		throw std::runtime_error ("Mismatching between number of activities and number of input queues! (#activities > #queues)");

	// Resetting bariers
	commPhaseBarrier.reset (activitiesFunctions.size());
	compPhaseBarrier.reset (activitiesFunctions.size());
	startBarrier.reset (1);


	// Setting up worker threads
	for (size_t i=0; i<activitiesFunctions.size(); i++) {
		// Binding packaged task to arguments
		auto lambdaFunction	= [&] (int index, std::vector<T> &inputItems, std::vector<LockableVector<T>> &outputItems) {
			workerFunction (index, inputItems, outputItems);
		};
		auto boundedFunction	= std::bind (lambdaFunction, i, std::ref(inputVectors[i]), std::ref(outputVectors));
		auto packagedTask		= std::packaged_task<void()> (boundedFunction);

		// Assigning created packaged_task to a worker
		workers[i].assignActivity (std::move(packagedTask));
	}

	// Starting workers and waiting for their completion
	startBarrier.decreaseBarrier ();
	commPhaseBarrier.waitForFinish ();
	
	return atExitF (outputVectors);
}